

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O3

Hop_Obj_t * Hop_Miter(Hop_Man_t *p,Vec_Ptr_t *vPairs)

{
  Hop_Obj_t *pHVar1;
  int nObjs;
  long lVar2;
  
  if (vPairs->nSize < 1) {
    __assert_fail("vPairs->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopOper.c"
                  ,300,"Hop_Obj_t *Hop_Miter(Hop_Man_t *, Vec_Ptr_t *)");
  }
  if ((vPairs->nSize & 1U) == 0) {
    lVar2 = 0;
    do {
      pHVar1 = Hop_Exor(p,(Hop_Obj_t *)vPairs->pArray[lVar2],(Hop_Obj_t *)vPairs->pArray[lVar2 + 1])
      ;
      *(ulong *)((long)vPairs->pArray + lVar2 * 4) = (ulong)pHVar1 ^ 1;
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < vPairs->nSize);
    nObjs = vPairs->nSize / 2;
    vPairs->nSize = nObjs;
    pHVar1 = Hop_Multi_rec(p,(Hop_Obj_t **)vPairs->pArray,nObjs,AIG_AND);
    return (Hop_Obj_t *)((ulong)pHVar1 ^ 1);
  }
  __assert_fail("vPairs->nSize % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopOper.c"
                ,0x12d,"Hop_Obj_t *Hop_Miter(Hop_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Hop_Obj_t * Hop_Miter( Hop_Man_t * p, Vec_Ptr_t * vPairs )
{
    int i;
    assert( vPairs->nSize > 0 );
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    for ( i = 0; i < vPairs->nSize; i += 2 )
        vPairs->pArray[i/2] = Hop_Not( Hop_Exor( p, (Hop_Obj_t *)vPairs->pArray[i], (Hop_Obj_t *)vPairs->pArray[i+1] ) );
    vPairs->nSize = vPairs->nSize/2;
    return Hop_Not( Hop_Multi_rec( p, (Hop_Obj_t **)vPairs->pArray, vPairs->nSize, AIG_AND ) );
}